

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_help.c
# Opt level: O0

void cfg_help_choice(autobuf *out,_Bool preamble,_func_char_ptr_size_t_void_ptr *callback,
                    size_t choice_count,void *ptr)

{
  char *pcVar1;
  char *pcVar2;
  ulong local_38;
  size_t i;
  void *ptr_local;
  size_t choice_count_local;
  _func_char_ptr_size_t_void_ptr *callback_local;
  _Bool preamble_local;
  autobuf *out_local;
  
  if (preamble) {
    cfg_append_printable_line(out,"    Parameter must be on of the following list:");
  }
  abuf_puts(out,"    ");
  for (local_38 = 0; local_38 < choice_count; local_38 = local_38 + 1) {
    pcVar1 = ", ";
    if (local_38 == 0) {
      pcVar1 = "";
    }
    pcVar2 = (*callback)(local_38,ptr);
    abuf_appendf(out,"%s\'%s\'",pcVar1,pcVar2);
  }
  abuf_puts(out,"\n");
  return;
}

Assistant:

void
cfg_help_choice(struct autobuf *out, bool preamble, const char *(*callback)(size_t idx, const void *ptr),
  size_t choice_count, const void *ptr) {
  size_t i;

  if (preamble) {
    cfg_append_printable_line(out, CFG_HELP_INDENT_PREFIX "Parameter must be on of the following list:");
  }

  abuf_puts(out, "    ");
  for (i = 0; i < choice_count; i++) {
    abuf_appendf(out, "%s'%s'", i == 0 ? "" : ", ", callback(i, ptr));
  }
  abuf_puts(out, "\n");
}